

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void mips_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  byte *pbVar1;
  DisasJumpType DVar2;
  CPUArchState_conflict14 *env;
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *tcg_ctx;
  uint64_t addr;
  hook *phVar3;
  TCGContext_conflict6 *pTVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uintptr_t o_3;
  undefined1 *puVar11;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  byte rt;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar15;
  byte count;
  int rd;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ushort uVar19;
  uint uVar20;
  uintptr_t o_1;
  TCGTemp *ts;
  list_item *plVar21;
  target_ulong tVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int16_t iVar28;
  ushort imm;
  uint uVar29;
  int iVar30;
  char cVar31;
  uint uVar32;
  int iVar33;
  uintptr_t o;
  TCGTemp *ts_00;
  ulong uVar34;
  int iVar35;
  uintptr_t o_2;
  TCGTemp *ts_01;
  uintptr_t o_6;
  TCGArg TStackY_d0;
  void *local_90;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  env = (CPUArchState_conflict14 *)cs->env_ptr;
  val = cs->uc;
  tcg_ctx = val->tcg_ctx;
  uVar23 = (uint)dcbase[2].pc_next & 0x87f800;
  local_58 = (TCGTemp *)dcbase->pc_next;
  if (val->use_exits == 0) {
    if ((TCGTemp *)val->exits[(long)val->nested_level + -1] == local_58) goto LAB_00868d89;
  }
  else {
    puVar11 = (undefined1 *)g_tree_lookup(val->ctl_exits,&local_58);
    if (puVar11 == &DAT_00000001) {
LAB_00868d89:
      gen_helper_wait(tcg_ctx,tcg_ctx->cpu_env);
      dcbase->is_jmp = DISAS_NORETURN;
      return;
    }
  }
  addr = dcbase->pc_next;
  _Var5 = _hook_exists_bounded(val->hook[2].head,addr);
  if (_Var5) {
    gen_save_pc(tcg_ctx,addr);
    local_90 = ((tcg_ctx->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar22 = dcbase->pc_next;
    pTVar12 = tcg_const_i32_mips64el(tcg_ctx,4);
    pTVar13 = tcg_const_i64_mips64el(tcg_ctx,(int64_t)val);
    pTVar14 = tcg_const_i64_mips64el(tcg_ctx,tVar22);
    ts_00 = (TCGTemp *)(pTVar13 + (long)tcg_ctx);
    ts = (TCGTemp *)(pTVar14 + (long)tcg_ctx);
    ts_01 = (TCGTemp *)(pTVar12 + (long)tcg_ctx);
    local_60 = (TCGTemp *)0x0;
    local_78 = ts_00;
    local_70 = ts;
    local_68 = ts_01;
    if (val->hooks_count[2] == 1) {
      plVar21 = (list_item *)(val->hook + 2);
      while (plVar21 = plVar21->next, plVar21 != (list_item *)0x0) {
        phVar3 = (hook *)plVar21->data;
        if (phVar3->to_delete == false) {
          pTVar13 = tcg_const_i64_mips64el(tcg_ctx,(int64_t)phVar3->user_data);
          local_60 = (TCGTemp *)(pTVar13 + (long)tcg_ctx);
          (*val->add_inline_hook)(val,phVar3,&local_78,4);
          tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar13 + (long)tcg_ctx));
        }
      }
    }
    else {
      pTVar12 = tcg_const_i32_mips64el(tcg_ctx,2);
      local_58 = ts_01;
      local_50 = (TCGTemp *)(pTVar12 + (long)tcg_ctx);
      local_48 = ts_00;
      local_40 = ts;
      tcg_gen_callN_mips64el(tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar12 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,ts);
    tcg_temp_free_internal_mips64el(tcg_ctx,ts_00);
    tcg_temp_free_internal_mips64el(tcg_ctx,ts_01);
    if (uVar23 == 0) {
      check_exit_request_mips64el(tcg_ctx);
    }
  }
  else {
    local_90 = (void *)0x0;
  }
  uVar18._0_4_ = dcbase[1].is_jmp;
  uVar18._4_4_ = dcbase[1].num_insns;
  if ((short)(undefined4)uVar18 < 0) {
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
    *(uint32_t *)&dcbase[1].pc_next = uVar6;
    pTVar4 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
    if ((dcbase->pc_next & 1) != 0) {
      pTVar13 = tcg_const_i64_mips64el(pTVar4,dcbase->pc_next);
      tcg_gen_st_i64_mips64el(pTVar4,pTVar13,pTVar4->cpu_env,0x648);
      tcg_temp_free_internal_mips64el(pTVar4,(TCGTemp *)(pTVar13 + (long)pTVar4));
LAB_00869011:
      iVar30 = 0xc;
      goto LAB_00869017;
    }
    uVar8 = uVar6 >> 10 & 0x3f;
    if (0x3b < uVar8 - 4) {
switchD_00868efa_caseD_8:
      uVar8 = decode_nanomips_32_48_opc
                        ((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
      TStackY_d0 = (TCGArg)uVar8;
      goto switchD_0086ab9b_default;
    }
    uVar24 = uVar6 >> 7 & 7;
    uVar18 = (ulong)uVar24;
    uVar17 = *(uint *)(decode_gpr_gpr3_map + uVar18 * 4);
    uVar16 = uVar6 >> 4 & 7;
    uVar32 = *(uint *)(decode_gpr_gpr3_map + (ulong)uVar16 * 4);
    uVar10 = *(uint *)(decode_gpr_gpr3_map + (ulong)(uVar6 & 0xe) * 2);
    switch(uVar8) {
    case 4:
      uVar17 = uVar6 >> 5 & 0x1f;
      if (uVar17 != 0) {
        uVar24 = uVar6 & 0x1f;
        goto LAB_00869e8b;
      }
      switch(uVar6 >> 3 & 3) {
      case 0:
switchD_0086a04b_caseD_22:
        iVar30 = 0x14;
        break;
      case 1:
        if ((uVar6 & 4) != 0) goto switchD_0086a04b_caseD_22;
        iVar30 = 0x11;
        break;
      case 2:
switchD_0086a04b_caseD_28:
        iVar30 = 0x12;
        break;
      case 3:
        if ((dcbase[2].pc_next & 0x400000) != 0) goto switchD_0086a04b_caseD_22;
LAB_0086a323:
        iVar30 = 0x10;
      }
      generate_exception_end((DisasContext_conflict6 *)dcbase,iVar30);
      goto LAB_0086a3c6;
    case 5:
      uVar24 = (uVar6 & 0xf) << 2;
      goto LAB_0086965d;
    case 6:
      iVar30 = (uVar6 & 0x3fe) + (uVar6 & 1) * -0x400;
      uVar9 = 0x10000000;
      goto LAB_0086954a;
    case 7:
      rt = (byte)(uVar6 >> 9) & 1 | 0x1e;
      count = (byte)uVar6 & 0xf;
      uVar19 = (ushort)uVar6 & 0xf0;
      if ((uVar6 >> 8 & 1) == 0) {
        gen_save((DisasContext_conflict6 *)dcbase,rt,count,'\0',uVar19);
        goto LAB_0086901c;
      }
      gen_restore((DisasContext_conflict6 *)dcbase,rt,count,'\0',uVar19);
      uVar9 = 8;
      uVar32 = 0x1f;
      uVar17 = 0;
      iVar30 = 0;
      goto LAB_008696be;
    default:
      goto switchD_00868efa_caseD_8;
    case 0xc:
      uVar9 = uVar6 >> 2 & 2;
      iVar28 = (int16_t)(uVar6 & 7);
      uVar8 = uVar17;
      if ((uVar6 & 7) == 0) {
        iVar28 = 8;
      }
      goto LAB_008693c6;
    case 0xd:
      uVar17 = uVar6 >> 5 & 0x1f;
      uVar24 = (uVar6 & 0x1f) << 2;
      uVar32 = 0x1d;
      goto LAB_0086965d;
    case 0xe:
      iVar30 = (uVar6 & 0x3fe) + (uVar6 & 1) * -0x400;
      uVar9 = 0x4110000;
LAB_0086954a:
      uVar32 = 0;
      goto LAB_008696b8;
    case 0xf:
      uVar8 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar6 >> 5 & 7 | uVar6 >> 6 & 8) * 4);
      uVar32 = *(uint *)(decode_gpr_gpr4_map + (ulong)((uVar6 & 7) + (uVar6 >> 4 & 1) * 8) * 4);
      uVar10 = uVar6 >> 3 & 1 | uVar6 >> 7 & 2;
      if (uVar10 != 1) {
        if (uVar10 == 0) {
          check_nms((DisasContext_conflict6 *)dcbase);
          uVar6 = 0x21;
          uVar17 = uVar8;
          goto LAB_0086a3c1;
        }
        goto switchD_0086a04b_caseD_22;
      }
      check_nms((DisasContext_conflict6 *)dcbase);
      gen_r6_muldiv((DisasContext_conflict6 *)dcbase,0x98,uVar8,uVar32,uVar8);
      goto LAB_0086901c;
    case 0x14:
      if ((uVar6 & 1) == 0) {
        uVar8 = uVar17;
        switch(uVar6 >> 2 & 3) {
        case 0:
          goto LAB_0086981f;
        case 1:
          uVar6 = 0x26;
          break;
        case 2:
          uVar6 = 0x24;
          break;
        case 3:
          uVar6 = 0x25;
        }
        goto LAB_0086a223;
      }
      gen_ldxs((DisasContext_conflict6 *)dcbase,uVar17,uVar32,uVar10);
      goto LAB_0086901c;
    case 0x15:
      uVar24 = (uVar6 & 0x7f) << 2;
      uVar32 = 0x1c;
LAB_0086965d:
      uVar6 = 0x8c000000;
      goto LAB_0086a10e;
    case 0x17:
      uVar24 = uVar6 & 3;
      switch(uVar6 >> 2 & 3) {
      case 0:
        uVar6 = 0x80000000;
        break;
      case 1:
        uVar17 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar18 * 4);
        uVar6 = 0xa0000000;
        uVar8 = uVar32;
        goto LAB_0086a1d4;
      case 2:
        uVar6 = 0x90000000;
        break;
      case 3:
switchD_0086930a_caseD_3:
        iVar30 = 0x14;
        goto LAB_00869017;
      }
      goto LAB_0086a10e;
    case 0x1c:
      if ((uVar6 & 0x40) == 0) goto switchD_0086930a_caseD_3;
      uVar8 = (uVar6 & 0x3f) << 2;
      uVar6 = 0x24000000;
      uVar32 = 0x1d;
      goto LAB_0086a47d;
    case 0x1d:
      check_nms((DisasContext_conflict6 *)dcbase);
      uVar8 = (uint)dcbase[1].pc_next;
      uVar24 = uVar8 >> 6 & 4 | uVar8 & 8;
      uVar17 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar8 >> 5 & 7 | uVar8 >> 6 & 8) * 4);
      uVar32 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar8 & 7 | uVar8 >> 1 & 8) * 4);
      uVar6 = 0x8c000000;
      goto LAB_0086a10e;
    case 0x1f:
      (*(code *)(&DAT_00baa1c0 + *(int *)(&DAT_00baa1c0 + (ulong)(uVar6 & 1 | uVar6 >> 2 & 2) * 4)))
                ();
      return;
    case 0x24:
      if ((uVar6 & 8) == 0) {
        uVar8 = (uVar6 & 7) << 2;
        uVar6 = 0x24000000;
        goto LAB_0086a47d;
      }
      TStackY_d0 = 2;
      uVar8 = uVar6 >> 5 & 0x1f;
      if (uVar8 == 0) break;
      uVar10 = uVar6 & 7 | (int)(uVar6 << 0x1b) >> 0x1c & 0xfffffff8U;
LAB_008697e9:
      TStackY_d0 = 2;
      gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,uVar8,uVar8,uVar10);
      break;
    case 0x25:
      uVar17 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar18 * 4);
      uVar24 = uVar6 & 0xf;
      goto LAB_00869607;
    case 0x26:
      iVar30 = (uVar6 & 0x7e) + (uVar6 & 1) * -0x80;
      uVar9 = 0x10000000;
      uVar32 = uVar17;
      goto LAB_008696b8;
    case 0x2c:
      if ((uVar6 & 1) == 0) {
        uVar6 = 0x21;
      }
      else {
        uVar6 = 0x23;
      }
      goto LAB_00869e8e;
    case 0x2d:
      uVar17 = uVar6 >> 5 & 0x1f;
      uVar24 = uVar6 & 0x1f;
      uVar32 = 0x1d;
      goto LAB_00869607;
    case 0x2e:
      iVar30 = (uVar6 & 0x7e) + (uVar6 & 1) * -0x80;
      uVar9 = 0x14000000;
      uVar32 = uVar17;
LAB_008696b8:
      uVar17 = 0;
LAB_008696be:
      TStackY_d0 = 2;
      gen_compute_branch_nm((DisasContext_conflict6 *)dcbase,uVar9,2,uVar32,uVar17,iVar30);
      break;
    case 0x2f:
    case 0x3f:
      check_nms((DisasContext_conflict6 *)dcbase);
      uVar10 = (uint)dcbase[1].pc_next;
      uVar17 = (uVar10 >> 8 & 1 | uVar10 >> 2 & 2) << 2;
      iVar30 = *(int *)(decode_nanomips_opc_gpr2reg1 + uVar17);
      iVar25 = *(int *)(decode_nanomips_opc_gpr2reg2 + uVar17);
      uVar34 = (ulong)(uVar10 & 7 | uVar10 >> 1 & 8);
      uVar18 = (ulong)(uVar10 >> 5 & 7 | uVar10 >> 6 & 8);
      pTVar13 = tcg_temp_new_i64(pTVar4);
      pTVar14 = tcg_temp_new_i64(pTVar4);
      if (uVar8 == 0x2f) {
        iVar35 = iVar30;
        iVar30 = *(int *)(decode_gpr_gpr4_zero_map + uVar34 * 4);
        iVar33 = iVar25;
        iVar25 = *(int *)(decode_gpr_gpr4_zero_map + uVar18 * 4);
      }
      else {
        iVar35 = *(int *)(decode_gpr_gpr4_map + uVar34 * 4);
        iVar33 = *(int *)(decode_gpr_gpr4_map + uVar18 * 4);
      }
      gen_load_gpr(pTVar4,pTVar13,iVar30);
      gen_load_gpr(pTVar4,pTVar14,iVar25);
      tcg_gen_mov_i64_mips64el(pTVar4,pTVar4->cpu_gpr[iVar35],pTVar13);
      tcg_gen_mov_i64_mips64el(pTVar4,pTVar4->cpu_gpr[iVar33],pTVar14);
      tcg_temp_free_internal_mips64el(pTVar4,(TCGTemp *)(pTVar13 + (long)pTVar4));
      tcg_temp_free_internal_mips64el(pTVar4,(TCGTemp *)(pTVar14 + (long)pTVar4));
      goto LAB_0086973f;
    case 0x34:
      uVar8 = 0xffffffff;
      if ((uVar6 & 0x7f) != 0x7f) {
        uVar8 = uVar6 & 0x7f;
      }
      tcg_gen_movi_i64_mips64el(pTVar4,pTVar4->cpu_gpr[(int)uVar17],(long)(int)uVar8);
LAB_0086973f:
      TStackY_d0 = 2;
      break;
    case 0x35:
      uVar17 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar18 * 4);
      uVar24 = uVar6 & 0x7f;
      uVar32 = 0x1c;
LAB_00869607:
      uVar24 = uVar24 << 2;
      uVar6 = 0xac000000;
      uVar8 = uVar32;
      goto LAB_0086a1d4;
    case 0x36:
      if ((uVar6 & 0xf) != 0) {
        uVar9 = (uVar24 <= uVar16 | 4) << 0x1a;
        iVar30 = (uVar6 & 0xf) * 2;
        goto LAB_008696be;
      }
      if ((uVar6 & 0x10) == 0) {
        uVar9 = 8;
        iVar30 = 0;
      }
      else {
        uVar9 = 9;
        iVar30 = 0x1f;
      }
      TStackY_d0 = 2;
      gen_compute_branch_nm((DisasContext_conflict6 *)dcbase,uVar9,2,uVar6 >> 5 & 0x1f,iVar30,0);
      break;
    case 0x3c:
      uVar8 = uVar6 & 0xf;
      uVar19 = 0xffff;
      if (uVar8 != 0xd) {
        uVar19 = (ushort)uVar8;
      }
      imm = 0xff;
      if (uVar8 != 0xc) {
        imm = uVar19;
      }
      uVar6 = 0x30000000;
      goto LAB_0086934e;
    case 0x3d:
      check_nms((DisasContext_conflict6 *)dcbase);
      uVar8 = (uint)dcbase[1].pc_next;
      uVar24 = uVar8 >> 6 & 4 | uVar8 & 8;
      uVar17 = *(uint *)(decode_gpr_gpr4_zero_map + (ulong)(uVar8 >> 5 & 7 | uVar8 >> 6 & 8) * 4);
      uVar8 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar8 & 7 | uVar8 >> 1 & 8) * 4);
LAB_0086929a:
      uVar6 = 0xac000000;
      goto LAB_0086a1d4;
    }
    goto switchD_0086ab9b_default;
  }
  if ((dcbase[2].pc_next & 0x400) == 0) {
    uVar6 = cpu_ldl_code_mips64el(env,dcbase->pc_next);
    *(uint32_t *)&dcbase[1].pc_next = uVar6;
    decode_opc((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
    goto LAB_00868e6d;
  }
  if ((uVar18 >> 0x28 & 1) != 0) {
    uVar7 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
    *(uint32_t *)&dcbase[1].pc_next = uVar7;
    if ((dcbase->pc_next & 1) != 0) {
      env->CP0_BadVAddr = dcbase->pc_next;
      goto LAB_00869011;
    }
    pTVar4 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
    uVar10 = (uint)dcbase[2].pc_next;
    if ((uVar10 >> 0x11 & 1) != 0) {
      if ((uVar7 >> 10 & 7) - 1 < 3) {
        if ((uVar10 >> 0x10 & 1) == 0) goto LAB_00869114;
      }
      else if (-1 < (short)uVar10) goto LAB_00869114;
      goto switchD_00869131_caseD_29;
    }
LAB_00869114:
    uVar8 = uVar7 >> 10 & 0x3f;
    switch(uVar8) {
    case 1:
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar6 = (uVar7 & 1) * 2 + 0x21;
      uVar10 = *(uint *)(xlat_map + (ulong)(uVar7 & 0xe) * 2);
      if ((dcbase[1].is_jmp & 0x2000) == DISAS_NEXT) {
        uVar10 = uVar32;
        uVar32 = *(uint *)(xlat_map + (ulong)(uVar7 & 0xe) * 2);
      }
      goto LAB_00869e8e;
    case 2:
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar24 = 0xffffffff;
      if ((uVar7 & 0xf) != 0xf) {
        uVar24 = uVar7 & 0xf;
      }
      uVar6 = 0x90000000;
      goto LAB_0086a10e;
    case 3:
      uVar17 = uVar7 >> 5 & 0x1f;
      uVar24 = uVar7 & 0x1f;
      goto LAB_00869e8b;
    default:
      decode_micromips32_opc((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
      goto LAB_00868e6d;
    case 9:
      uVar10 = uVar7 >> 1 & 7;
      uVar9 = (uVar7 & 1) * 2;
      iVar28 = (int16_t)uVar10;
      uVar8 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      if (uVar10 == 0) {
        iVar28 = 8;
      }
      goto LAB_008693c6;
    case 10:
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar24 = uVar7 * 2 & 0x1e;
      uVar6 = 0x94000000;
      goto LAB_0086a10e;
    case 0xb:
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      imm = *(ushort *)(gen_andi16_decoded_imm + (ulong)(uVar7 & 0xf) * 4);
      uVar6 = 0x30000000;
      goto LAB_0086934e;
    case 0x11:
      if ((dcbase[1].is_jmp & 0x2000) == DISAS_NEXT) {
        uVar10 = uVar7 >> 4;
        if (0x31 < (uVar10 & 0x3f)) goto switchD_0086a04b_caseD_22;
        uVar17 = *(uint *)(xlat_map + (uVar7 >> 1 & 0x1c));
        uVar32 = *(uint *)(xlat_map + (ulong)(uVar7 & 7) * 4);
        uVar8 = uVar17;
        switch(uVar10 & 0x3f) {
        case 0:
        case 1:
        case 2:
        case 3:
          goto LAB_0086981f;
        case 4:
        case 5:
        case 6:
        case 7:
          uVar6 = 0x26;
          break;
        case 8:
        case 9:
        case 10:
        case 0xb:
          uVar6 = 0x24;
          break;
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
          uVar6 = 0x25;
          break;
        case 0x10:
        case 0x11:
        case 0x12:
        case 0x13:
          iVar30 = *(int *)(gen_pool16c_insn_swm_convert + (ulong)(uVar10 & 3) * 4);
          uVar6 = 5;
          goto LAB_0086a557;
        case 0x14:
        case 0x15:
        case 0x16:
        case 0x17:
          iVar30 = *(int *)(gen_pool16c_insn_swm_convert + (ulong)(uVar10 & 3) * 4);
          uVar6 = 0xd;
LAB_0086a557:
          iVar28 = (int16_t)((uVar7 & 0xf) << 2);
          goto LAB_0086ab3f;
        case 0x18:
        case 0x19:
          iVar30 = 4;
          goto LAB_0086ac56;
        case 0x1a:
        case 0x1b:
          iVar30 = 0;
LAB_0086ac56:
          TStackY_d0 = 2;
          gen_compute_branch((DisasContext_conflict6 *)dcbase,8,2,uVar7 & 0x1f,0,0,iVar30);
          goto switchD_0086ab9b_default;
        case 0x1c:
        case 0x1d:
          iVar30 = 4;
          goto LAB_0086ac28;
        case 0x1e:
        case 0x1f:
          iVar30 = 2;
LAB_0086ac28:
          TStackY_d0 = 2;
          gen_compute_branch((DisasContext_conflict6 *)dcbase,9,2,uVar7 & 0x1f,0x1f,0,iVar30);
          pbVar1 = (byte *)((long)&dcbase[2].pc_next + 2);
          *pbVar1 = *pbVar1 | 2;
          goto switchD_0086ab9b_default;
        case 0x20:
        case 0x21:
          uVar6 = 0x10;
          goto LAB_0086abfd;
        default:
          goto switchD_0086a04b_caseD_22;
        case 0x24:
        case 0x25:
          uVar6 = 0x12;
LAB_0086abfd:
          gen_HILO((DisasContext_conflict6 *)dcbase,uVar6,0,uVar7 & 0x1f);
          goto LAB_0086a3c6;
        case 0x28:
          goto switchD_0086a04b_caseD_28;
        case 0x2c:
          check_insn((DisasContext_conflict6 *)dcbase,0x20);
          goto LAB_0086a323;
        case 0x30:
        case 0x31:
          gen_compute_branch((DisasContext_conflict6 *)dcbase,8,2,0x1f,0,0,0);
          uVar10 = (uVar7 & 0x1f) << 2;
          uVar8 = 0x1d;
          goto LAB_008697e9;
        }
        goto LAB_0086a223;
      }
      uVar24 = uVar7 >> 7 & 7;
      uVar17 = *(uint *)(xlat_map + (ulong)uVar24 * 4);
      uVar16 = uVar7 >> 4;
      uVar32 = *(uint *)(xlat_map + (ulong)(uVar16 & 7) * 4);
      uVar8 = uVar17;
      switch(uVar7 & 0xf) {
      case 0:
LAB_0086981f:
        uVar6 = 0x27;
        uVar8 = uVar32;
        uVar32 = 0;
        break;
      case 1:
        uVar6 = 0x24;
        break;
      case 2:
        iVar28 = (int16_t)((uVar16 & 0xf) << 2);
        uVar6 = 5;
        goto LAB_0086ab35;
      case 3:
        if ((uVar7 & 0x10) == 0) {
          uVar32 = uVar7 >> 5 & 0x1f;
          uVar8 = 0;
          uVar6 = 8;
          uVar17 = 0;
LAB_0086abb9:
          iVar25 = 2;
          TStackY_d0 = 2;
          iVar30 = 0;
          goto LAB_00869e33;
        }
        TStackY_d0 = 2;
        gen_compute_branch((DisasContext_conflict6 *)dcbase,8,2,0x1f,0,0,0);
        gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,0x1d,0x1d,uVar7 >> 3 & 0x7c);
        goto switchD_0086ab9b_default;
      default:
        gen_movep((DisasContext_conflict6 *)dcbase,uVar24,uVar16 & 7,uVar7 >> 1 & 4 | uVar7 & 3);
        goto LAB_0086a3c6;
      case 8:
        uVar6 = 0x26;
        break;
      case 9:
        uVar6 = 0x25;
        break;
      case 10:
        iVar28 = (int16_t)((uVar16 & 0xf) << 2);
        uVar6 = 0xd;
LAB_0086ab35:
        iVar30 = (uVar7 >> 8 & 3) + 0x11;
LAB_0086ab3f:
        gen_ldst_multiple((DisasContext_conflict6 *)dcbase,uVar6,iVar30,0x1d,iVar28);
        goto LAB_0086a3c6;
      case 0xb:
        uVar8 = (uVar7 & 0x3f) - 0xb;
        TStackY_d0 = 2;
        switch(uVar8 * 0x10000000 | uVar8 >> 4) {
        case 0:
        case 2:
          uVar32 = uVar7 >> 5 & 0x1f;
          uVar8 = 0;
          uVar6 = 9;
          uVar17 = 0x1f;
          goto LAB_0086abb9;
        case 1:
          iVar30 = 0x12;
          break;
        case 3:
          if ((uVar10 >> 0x16 & 1) == 0) {
            iVar30 = 0x10;
          }
          else {
            iVar30 = 0x14;
          }
          break;
        default:
          goto switchD_0086ab9b_default;
        }
        generate_exception((DisasContext_conflict6 *)dcbase,iVar30);
        goto switchD_0086ab9b_default;
      }
LAB_0086a223:
      gen_logic((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar8,uVar32);
LAB_0086a3c6:
      TStackY_d0 = 2;
      goto switchD_0086ab9b_default;
    case 0x12:
      uVar17 = uVar7 >> 5 & 0x1f;
      uVar24 = (uVar7 & 0x1f) << 2;
      uVar32 = 0x1d;
      goto LAB_0086a103;
    case 0x13:
      if ((uVar7 & 1) != 0) {
        uVar8 = uVar7 >> 1 & 0x1ff;
        if (uVar8 < 2) {
          uVar8 = uVar8 | 0x100;
        }
        else if (0xff < uVar8) {
          if (uVar8 < 0x1fe) {
            uVar8 = uVar7 >> 1 | 0xfffffe00;
          }
          else {
            uVar8 = uVar8 - 0x300;
          }
        }
        gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,0x1d,0x1d,uVar8 << 2);
        goto LAB_0086a3c6;
      }
      uVar8 = (int)(uVar7 << 0x1b) >> 0x1c;
      uVar17 = uVar7 >> 5 & 0x1f;
      uVar6 = 0x24000000;
      uVar32 = uVar17;
      goto LAB_0086a47d;
    case 0x19:
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar24 = (int)(uVar7 << 0x19) >> 0x17;
      uVar32 = 0x1c;
      goto LAB_0086a103;
    case 0x1a:
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar24 = (uVar7 & 0xf) << 2;
LAB_0086a103:
      uVar6 = 0x8c000000;
      goto LAB_0086a10e;
    case 0x1b:
      uVar17 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      if ((uVar7 & 1) == 0) {
        uVar8 = *(uint *)(gen_addiur2_decoded_imm + (ulong)(uVar7 & 0xe) * 2);
        uVar6 = 0x24000000;
        uVar32 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      }
      else {
        uVar8 = (uVar7 & 0x7e) * 2;
        uVar32 = 0x1d;
        uVar6 = 0x24000000;
      }
      goto LAB_0086a47d;
    case 0x21:
      check_insn_opc_removed((DisasContext_conflict6 *)dcbase,0x2000);
      uVar8 = (uint)dcbase[1].pc_next;
      if ((uVar8 & 1) != 0) goto switchD_00869131_caseD_29;
      gen_movep((DisasContext_conflict6 *)dcbase,uVar8 >> 7 & 7,uVar8 >> 4 & 7,uVar8 >> 1 & 7);
      goto LAB_0086901c;
    case 0x22:
      uVar17 = *(uint *)(mmreg2_map + (uVar7 >> 5 & 0x1c));
      uVar24 = uVar7 & 0xf;
      uVar6 = 0xa0000000;
      uVar8 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      break;
    case 0x23:
    case 0x2b:
      uVar6 = (uVar8 == 0x2b | 4) << 0x1a;
      uVar32 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      iVar30 = (int)(uVar7 << 0x19) >> 0x18;
      DVar2 = dcbase[1].is_jmp;
      goto LAB_00869e2d;
    case 0x29:
    case 0x31:
    case 0x39:
      goto switchD_00869131_caseD_29;
    case 0x2a:
      uVar17 = *(uint *)(mmreg2_map + (uVar7 >> 5 & 0x1c));
      uVar24 = uVar7 * 2 & 0x1e;
      uVar6 = 0xa4000000;
      uVar8 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      break;
    case 0x32:
      uVar17 = uVar7 >> 5 & 0x1f;
      uVar24 = uVar7 & 0x1f;
      uVar8 = 0x1d;
      goto LAB_0086a1c9;
    case 0x33:
      iVar30 = (int)(uVar7 << 0x16) >> 0x15;
      DVar2 = dcbase[1].is_jmp;
      uVar6 = 0x10000000;
      uVar32 = 0;
LAB_00869e2d:
      uVar8 = ~DVar2 >> 0xb & 4;
      iVar25 = 2;
      TStackY_d0 = 2;
      uVar17 = 0;
      goto LAB_00869e33;
    case 0x3a:
      uVar17 = *(uint *)(mmreg2_map + (uVar7 >> 5 & 0x1c));
      uVar8 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar24 = uVar7 & 0xf;
LAB_0086a1c9:
      uVar24 = uVar24 << 2;
      uVar6 = 0xac000000;
      break;
    case 0x3b:
      uVar8 = 0xffffffff;
      if ((uVar7 & 0x7f) != 0x7f) {
        uVar8 = uVar7 & 0x7f;
      }
      tcg_gen_movi_i64_mips64el
                (pTVar4,pTVar4->cpu_gpr[*(int *)(xlat_map + (uVar7 >> 5 & 0x1c))],(long)(int)uVar8);
      goto LAB_0086901c;
    }
    goto LAB_0086a1d4;
  }
  if ((uVar18 >> 0x20 & 1) == 0) {
    generate_exception_end((DisasContext_conflict6 *)dcbase,0x14);
    if (dcbase->is_jmp == DISAS_NORETURN) {
      return;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
               ,0x78fe,"ctx->base.is_jmp == DISAS_NORETURN");
  }
  uVar9 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
  *(uint32_t *)&dcbase[1].pc_next = uVar9;
  pTVar4 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  uVar10 = uVar9 >> 2 & 7;
  iVar28 = 8;
  if (uVar10 != 0) {
    iVar28 = (int16_t)uVar10;
  }
  uVar16 = uVar9 >> 8 & 7;
  uVar32 = *(uint *)(xlat_map + (ulong)uVar16 * 4);
  uVar20 = uVar9 >> 5 & 7;
  uVar17 = *(uint *)(xlat_map + (ulong)uVar20 * 4);
  uVar24 = uVar9 & 0x1f;
  cVar31 = (char)uVar9;
  uVar8 = uVar32;
  switch(uVar9 >> 0xb & 0x1f) {
  case 0:
    uVar8 = (uVar9 & 0xff) << 2;
    uVar6 = 0x24000000;
    uVar17 = uVar32;
    uVar32 = 0x1d;
    goto LAB_0086a47d;
  case 1:
    gen_addiupc((DisasContext_conflict6 *)dcbase,uVar32,(uVar9 & 0xff) << 2,0,0);
    goto LAB_0086901c;
  case 2:
    iVar30 = (int)(short)(uVar9 << 5) >> 4;
    TStackY_d0 = 2;
LAB_00869a21:
    uVar6 = 0x10000000;
    iVar25 = (int)TStackY_d0;
    uVar32 = 0;
    goto LAB_00869b67;
  case 3:
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next + 2);
    uVar8 = (uint)dcbase[1].pc_next;
    iVar30 = ((uVar8 & 0x3e0) << 0xb | uVar6 | (uVar8 & 0x1f) << 0x15) << 2;
    uVar6 = 0x74000000;
    if ((uVar8 >> 10 & 1) == 0) {
      uVar6 = 0xc000000;
    }
    uVar8 = 2;
    TStackY_d0 = 4;
    iVar25 = 4;
    goto LAB_00869e33;
  case 4:
    uVar6 = 0x10000000;
    goto LAB_00869b64;
  case 5:
    uVar6 = 0x14000000;
LAB_00869b64:
    TStackY_d0 = 2;
    iVar30 = cVar31 * 2;
    iVar25 = 2;
LAB_00869b67:
    uVar8 = 0;
    uVar17 = 0;
LAB_00869e33:
    gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar6,iVar25,uVar32,uVar17,iVar30,uVar8);
    goto switchD_0086ab9b_default;
  case 6:
    switch(uVar9 & 3) {
    case 0:
      uVar9 = 0;
      uVar32 = uVar17;
      break;
    case 1:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar9 = 0x38;
      uVar32 = uVar17;
      break;
    case 2:
      TStackY_d0 = 2;
      gen_shift_imm((DisasContext_conflict6 *)dcbase,2,uVar32,uVar17,iVar28);
      goto switchD_0086ab9b_default;
    case 3:
      uVar9 = 3;
      uVar32 = uVar17;
    }
    goto LAB_008693c6;
  case 7:
    check_insn((DisasContext_conflict6 *)dcbase,4);
    check_mips_64((DisasContext_conflict6 *)dcbase);
    uVar24 = uVar24 << 3;
    uVar6 = 0xdc000000;
    break;
  case 8:
    if ((uVar9 & 0x10) == 0) {
      uVar6 = 0x24000000;
    }
    else {
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x64000000;
    }
    uVar8 = (int)(uVar9 << 0x1c) >> 0x1c;
    goto LAB_0086a47d;
  case 9:
    uVar8 = (uint)cVar31;
    uVar6 = 0x24000000;
    uVar17 = uVar32;
    goto LAB_0086a47d;
  case 10:
    uVar6 = 0x28000000;
    goto LAB_00869beb;
  case 0xb:
    uVar6 = 0x2c000000;
LAB_00869beb:
    gen_slt_imm((DisasContext_conflict6 *)dcbase,uVar6,0x18,uVar32,(ushort)uVar9 & 0xff);
    goto LAB_0086901c;
  case 0xc:
    switch(uVar16) {
    case 0:
      iVar30 = (int)cVar31;
      TStackY_d0 = 2;
LAB_008699c4:
      uVar6 = 0x10000000;
      break;
    case 1:
      iVar30 = (int)cVar31;
      TStackY_d0 = 2;
LAB_0086a4ac:
      uVar6 = 0x14000000;
      break;
    case 2:
      uVar24 = (uVar9 & 0xff) << 2;
      uVar17 = 0x1f;
      uVar8 = 0x1d;
      goto LAB_0086929a;
    case 3:
      uVar8 = (int)cVar31 << 3;
      uVar17 = 0x1d;
      uVar6 = 0x24000000;
      uVar32 = uVar17;
      goto LAB_0086a47d;
    case 4:
      check_insn((DisasContext_conflict6 *)dcbase,0x20);
      uVar8 = (uint)dcbase[1].pc_next;
      iVar30 = 0x80;
      if ((uVar8 & 0xf) != 0) {
        iVar30 = (uVar8 & 0xf) * 8;
      }
      if ((char)uVar8 < '\0') {
        gen_mips16_save((DisasContext_conflict6 *)dcbase,0,0,uVar8 & 0x40,uVar8 & 0x20,uVar8 & 0x10,
                        iVar30);
      }
      else {
        gen_mips16_restore((DisasContext_conflict6 *)dcbase,0,0,uVar8 & 0x40,uVar8 & 0x20,
                           uVar8 & 0x10,iVar30);
      }
      goto LAB_0086a3c6;
    case 5:
      uVar24 = *(uint *)(xlat_map + (ulong)(uVar9 & 7) * 4);
      uVar17 = uVar20 | uVar9 & 0x18;
      goto LAB_00869e8b;
    case 6:
      iVar30 = 0x14;
      goto LAB_00869017;
    case 7:
LAB_00869e8b:
      uVar6 = 0x21;
      uVar10 = uVar17;
      uVar32 = uVar24;
      uVar17 = 0;
LAB_00869e8e:
      gen_arith((DisasContext_conflict6 *)dcbase,uVar6,uVar10,uVar32,uVar17);
      goto LAB_0086901c;
    }
    uVar32 = 0x18;
    iVar30 = iVar30 * 2;
    iVar25 = (int)TStackY_d0;
    goto LAB_00869b67;
  case 0xd:
    uVar8 = uVar9 & 0xff;
    uVar6 = 0x24000000;
    uVar17 = uVar32;
    uVar32 = 0;
LAB_0086a47d:
    gen_arith_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar32,uVar8);
    goto LAB_0086901c;
  case 0xe:
    imm = (ushort)uVar9 & 0xff;
    uVar17 = 0x18;
    uVar6 = 0x38000000;
LAB_0086934e:
    gen_logic_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar32,imm);
    goto LAB_0086901c;
  case 0xf:
    check_insn((DisasContext_conflict6 *)dcbase,4);
    check_mips_64((DisasContext_conflict6 *)dcbase);
    uVar24 = uVar24 << 3;
    uVar6 = 0xfc000000;
    goto LAB_0086a1d4;
  case 0x10:
    uVar6 = 0x80000000;
    break;
  case 0x11:
    uVar24 = uVar24 * 2;
    uVar6 = 0x84000000;
    break;
  case 0x12:
    uVar24 = (uVar9 & 0xff) << 2;
    uVar6 = 0x8c000000;
    uVar17 = uVar32;
    uVar32 = 0x1d;
    break;
  case 0x13:
    uVar24 = uVar24 << 2;
    uVar6 = 0x8c000000;
    break;
  case 0x14:
    uVar6 = 0x90000000;
    break;
  case 0x15:
    uVar24 = uVar24 * 2;
    uVar6 = 0x94000000;
    break;
  case 0x16:
    uVar24 = (uVar9 & 0xff) << 2;
    uVar6 = 0x8c000005;
    uVar17 = uVar32;
    uVar32 = 0;
    break;
  case 0x17:
    check_insn((DisasContext_conflict6 *)dcbase,4);
    check_mips_64((DisasContext_conflict6 *)dcbase);
    uVar24 = uVar24 << 2;
    uVar6 = 0x9c000000;
    break;
  case 0x18:
    uVar6 = 0xa0000000;
    goto LAB_0086a1d4;
  case 0x19:
    uVar24 = uVar24 * 2;
    uVar6 = 0xa4000000;
    goto LAB_0086a1d4;
  case 0x1a:
    uVar24 = (uVar9 & 0xff) << 2;
    uVar6 = 0xac000000;
    uVar8 = 0x1d;
    uVar17 = uVar32;
    goto LAB_0086a1d4;
  case 0x1b:
    uVar24 = uVar24 << 2;
    uVar6 = 0xac000000;
LAB_0086a1d4:
    gen_st((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar8,uVar24);
    goto LAB_0086901c;
  case 0x1c:
    uVar8 = *(uint *)(xlat_map + (ulong)uVar10 * 4);
    switch(uVar9 & 3) {
    case 0:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x2d;
      break;
    case 1:
      uVar6 = 0x21;
      break;
    case 2:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x2f;
      break;
    case 3:
      uVar6 = 0x23;
    }
LAB_0086a3c1:
    gen_arith((DisasContext_conflict6 *)dcbase,uVar6,uVar8,uVar32,uVar17);
    goto LAB_0086a3c6;
  case 0x1d:
    uVar8 = uVar17;
    switch(uVar24) {
    case 0:
      if ((uVar9 & 0x80) != 0) {
        check_insn((DisasContext_conflict6 *)dcbase,0x20);
      }
      uVar6 = 9 - ((uVar9 & 0x40) == 0);
      uVar17 = 0x1f;
      uVar8 = uVar17;
      if ((uVar9 & 0x20) == 0) {
        uVar8 = uVar32;
      }
      uVar32 = uVar8;
      uVar8 = (uVar9 & 0x80) >> 6 ^ 2;
      goto LAB_0086abb9;
    case 1:
      check_insn((DisasContext_conflict6 *)dcbase,0x20);
      iVar30 = 0x10;
      goto LAB_00869017;
    case 2:
      uVar6 = 0x2a;
      goto LAB_0086a9d1;
    case 3:
      uVar6 = 0x2b;
LAB_0086a9d1:
      gen_slt((DisasContext_conflict6 *)dcbase,uVar6,0x18,uVar32,uVar17);
      goto LAB_0086901c;
    case 4:
      uVar6 = 4;
      goto LAB_0086aaae;
    case 5:
      iVar30 = 0x12;
      goto LAB_00869017;
    case 6:
      uVar6 = 6;
      goto LAB_0086aaae;
    case 7:
      uVar6 = 7;
      goto LAB_0086aaae;
    case 8:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar9 = 0x3a;
      uVar32 = uVar17;
      goto LAB_008693c6;
    default:
switchD_00869131_caseD_29:
      iVar30 = 0x14;
LAB_00869017:
      generate_exception_end((DisasContext_conflict6 *)dcbase,iVar30);
      goto LAB_0086901c;
    case 10:
      uVar6 = 0x26;
      uVar17 = uVar32;
      uVar32 = 0x18;
      goto LAB_0086aa02;
    case 0xb:
      uVar6 = 0x23;
      uVar10 = uVar32;
      uVar32 = 0;
      goto LAB_00869e8e;
    case 0xc:
      uVar6 = 0x24;
      uVar17 = uVar32;
      goto LAB_0086aa02;
    case 0xd:
      uVar6 = 0x25;
      uVar17 = uVar32;
      goto LAB_0086aa02;
    case 0xe:
      uVar6 = 0x26;
      uVar17 = uVar32;
      goto LAB_0086aa02;
    case 0xf:
      uVar6 = 0x27;
      uVar8 = 0;
LAB_0086aa02:
      gen_logic((DisasContext_conflict6 *)dcbase,uVar6,uVar32,uVar17,uVar8);
      goto LAB_0086901c;
    case 0x10:
      uVar6 = 0x10;
      goto LAB_0086aa36;
    case 0x11:
      check_insn((DisasContext_conflict6 *)dcbase,0x20);
      switch(uVar20) {
      case 0:
        tcg_gen_ext8u_i64_mips64el(pTVar4,pTVar4->cpu_gpr[(int)uVar32],pTVar4->cpu_gpr[(int)uVar32])
        ;
        break;
      case 1:
        tcg_gen_ext16u_i64_mips64el
                  (pTVar4,pTVar4->cpu_gpr[(int)uVar32],pTVar4->cpu_gpr[(int)uVar32]);
        break;
      case 2:
        check_insn((DisasContext_conflict6 *)dcbase,0x80);
        check_mips_64((DisasContext_conflict6 *)dcbase);
        tcg_gen_ext32u_i64_mips64el
                  (pTVar4,pTVar4->cpu_gpr[(int)uVar32],pTVar4->cpu_gpr[(int)uVar32]);
        break;
      default:
        goto switchD_00869131_caseD_29;
      case 4:
        tcg_gen_ext8s_i64_mips64el(pTVar4,pTVar4->cpu_gpr[(int)uVar32],pTVar4->cpu_gpr[(int)uVar32])
        ;
        break;
      case 5:
        tcg_gen_ext16s_i64_mips64el
                  (pTVar4,pTVar4->cpu_gpr[(int)uVar32],pTVar4->cpu_gpr[(int)uVar32]);
        break;
      case 6:
        check_insn((DisasContext_conflict6 *)dcbase,0x80);
        check_mips_64((DisasContext_conflict6 *)dcbase);
        tcg_gen_ext32s_i64_mips64el
                  (pTVar4,pTVar4->cpu_gpr[(int)uVar32],pTVar4->cpu_gpr[(int)uVar32]);
      }
      goto LAB_0086901c;
    case 0x12:
      uVar6 = 0x12;
LAB_0086aa36:
      gen_HILO((DisasContext_conflict6 *)dcbase,uVar6,0,uVar32);
      goto LAB_0086901c;
    case 0x13:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar9 = 0x3b;
      uVar32 = uVar17;
LAB_008693c6:
      gen_shift_imm((DisasContext_conflict6 *)dcbase,uVar9,uVar8,uVar32,iVar28);
      goto LAB_0086901c;
    case 0x14:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x14;
      goto LAB_0086aaae;
    case 0x16:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x16;
      goto LAB_0086aaae;
    case 0x17:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x17;
LAB_0086aaae:
      gen_shift((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar32,uVar17);
      goto LAB_0086901c;
    case 0x18:
      uVar6 = 0x18;
      break;
    case 0x19:
      uVar6 = 0x19;
      break;
    case 0x1a:
      uVar6 = 0x1a;
      break;
    case 0x1b:
      uVar6 = 0x1b;
      break;
    case 0x1c:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x1c;
      break;
    case 0x1d:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x1d;
      break;
    case 0x1e:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x1e;
      break;
    case 0x1f:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x1f;
    }
    gen_muldiv((DisasContext_conflict6 *)dcbase,uVar6,0,uVar32,uVar17);
    goto LAB_0086901c;
  case 0x1e:
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next + 2);
    uVar10 = (int)dcbase[1].pc_next << 0x10 | uVar6;
    *(uint *)&dcbase[1].pc_next = uVar10;
    uVar8 = uVar6 >> 0xb & 0x1f;
    if (0x1f < uVar8) {
switchD_00869c94_caseD_3:
      generate_exception_end((DisasContext_conflict6 *)dcbase,0x14);
      goto LAB_00868e6d;
    }
    uVar16 = uVar6 >> 8 & 7;
    uVar32 = *(uint *)(xlat_map + (ulong)uVar16 * 4);
    uVar17 = *(uint *)(xlat_map + (uVar6 >> 3 & 0x1c));
    uVar26 = uVar10 >> 0x10;
    uVar27 = uVar26 << 0xb;
    uVar29 = uVar26 & 0x7e0;
    uVar20 = uVar6 & 0x1f;
    uVar19 = (ushort)uVar20 | (ushort)uVar29 | (ushort)uVar27;
    uVar24 = uVar32;
    switch(uVar8) {
    case 0:
      iVar30 = (int)(short)uVar19;
      uVar6 = 0x24000000;
      uVar17 = uVar32;
      uVar32 = 0x1d;
      goto LAB_0086acc8;
    case 1:
      gen_addiupc((DisasContext_conflict6 *)dcbase,uVar32,(int)(short)uVar19,0,1);
      goto LAB_00868e6d;
    case 2:
      iVar30 = (short)uVar19 * 2;
      TStackY_d0 = 4;
      goto LAB_00869a21;
    default:
      goto switchD_00869c94_caseD_3;
    case 4:
      uVar6 = 0x10000000;
      goto LAB_0086a703;
    case 5:
      uVar6 = 0x14000000;
LAB_0086a703:
      TStackY_d0 = 4;
      iVar30 = (short)uVar19 * 2;
      iVar25 = 4;
      goto LAB_00869b67;
    case 6:
      switch(uVar6 & 3) {
      case 0:
        uVar6 = 0;
        break;
      case 1:
        check_mips_64((DisasContext_conflict6 *)dcbase);
        uVar6 = 0x38;
        break;
      case 2:
        uVar6 = 2;
        break;
      case 3:
        uVar6 = 3;
      }
      gen_shift_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar32,uVar17,
                    (ushort)(uVar10 >> 0x16) & 0x1f);
      goto LAB_00868e6d;
    case 7:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0xdc000000;
      break;
    case 8:
      iVar30 = (int)((uVar26 & 0x7f0 | uVar6 & 0xf) << 0x11 | uVar26 << 0x1c) >> 0x11;
      if ((uVar6 & 0x10) == 0) {
        uVar6 = 0x24000000;
      }
      else {
        check_mips_64((DisasContext_conflict6 *)dcbase);
        uVar6 = 0x64000000;
      }
      goto LAB_0086acc8;
    case 9:
      iVar30 = (int)(short)uVar19;
      uVar6 = 0x24000000;
      uVar17 = uVar32;
LAB_0086acc8:
      gen_arith_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar32,iVar30);
      goto LAB_00868e6d;
    case 10:
      uVar6 = 0x28000000;
      goto LAB_0086a81f;
    case 0xb:
      uVar6 = 0x2c000000;
LAB_0086a81f:
      gen_slt_imm((DisasContext_conflict6 *)dcbase,uVar6,0x18,uVar32,uVar19);
      goto LAB_00868e6d;
    case 0xc:
      switch((ulong)uVar16) {
      case 0:
        iVar30 = (int)(short)uVar19;
        TStackY_d0 = 4;
        goto LAB_008699c4;
      case 1:
        iVar30 = (int)(short)uVar19;
        TStackY_d0 = 4;
        goto LAB_0086a4ac;
      case 2:
        uVar17 = 0x1f;
        uVar6 = 0xac000000;
        uVar24 = 0x1d;
        goto LAB_0086a8b2;
      case 3:
        iVar30 = (int)(short)uVar19;
        uVar6 = 0x24000000;
        uVar17 = 0x1d;
        uVar32 = uVar17;
        goto LAB_0086acc8;
      case 4:
        check_insn((DisasContext_conflict6 *)dcbase,0x20);
        uVar8 = (uint)dcbase[1].pc_next;
        uVar32 = uVar8 >> 0x18 & 7;
        uVar17 = uVar8 >> 0x10 & 0xf;
        uVar10 = uVar8 >> 6 & 1;
        uVar24 = uVar8 >> 5 & 1;
        uVar16 = uVar8 >> 4 & 1;
        iVar30 = (uVar8 & 0xf | uVar8 >> 0x10 & 0xf0) << 3;
        if ((char)uVar8 < '\0') {
          gen_mips16_save((DisasContext_conflict6 *)dcbase,uVar32,uVar17,uVar10,uVar24,uVar16,iVar30
                         );
        }
        else {
          gen_mips16_restore((DisasContext_conflict6 *)dcbase,uVar32,uVar17,uVar10,uVar24,uVar16,
                             iVar30);
        }
        break;
      default:
        goto switchD_00869c94_caseD_3;
      }
      goto LAB_00868e6d;
    case 0xd:
      tcg_gen_movi_i64_mips64el
                (pTVar4,pTVar4->cpu_gpr[(int)uVar32],(ulong)(uVar20 | uVar29 | uVar27 & 0xffff));
      goto LAB_0086a858;
    case 0xe:
      tcg_gen_xori_i64_mips64el
                (pTVar4,pTVar4->cpu_gpr[0x18],pTVar4->cpu_gpr[(int)uVar32],
                 (ulong)(uVar20 | uVar29 | uVar27 & 0xffff));
LAB_0086a858:
      TStackY_d0 = 4;
      goto switchD_0086ab9b_default;
    case 0xf:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0xfc000000;
      goto LAB_0086a8b2;
    case 0x10:
      uVar6 = 0x80000000;
      break;
    case 0x11:
      uVar6 = 0x84000000;
      break;
    case 0x12:
      uVar6 = 0x8c000000;
      uVar17 = uVar32;
      uVar32 = 0x1d;
      break;
    case 0x13:
      uVar6 = 0x8c000000;
      break;
    case 0x14:
      uVar6 = 0x90000000;
      break;
    case 0x15:
      uVar6 = 0x94000000;
      break;
    case 0x16:
      uVar6 = 0x8c000005;
      uVar17 = uVar32;
      uVar32 = 0;
      break;
    case 0x17:
      check_insn((DisasContext_conflict6 *)dcbase,4);
      check_mips_64((DisasContext_conflict6 *)dcbase);
      uVar6 = 0x9c000000;
      break;
    case 0x18:
      uVar6 = 0xa0000000;
      goto LAB_0086a8b2;
    case 0x19:
      uVar6 = 0xa4000000;
      goto LAB_0086a8b2;
    case 0x1a:
      uVar6 = 0xac000000;
      uVar24 = 0x1d;
      uVar17 = uVar32;
      goto LAB_0086a8b2;
    case 0x1b:
      uVar6 = 0xac000000;
LAB_0086a8b2:
      gen_st((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar24,(int)(short)uVar19);
      goto LAB_00868e6d;
    case 0x1f:
      decode_i64_mips16((DisasContext_conflict6 *)dcbase,uVar17,uVar16,uVar19,1);
      goto LAB_00868e6d;
    }
    gen_ld((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar32,(int)(short)uVar19);
LAB_00868e6d:
    TStackY_d0 = 4;
    goto switchD_0086ab9b_default;
  case 0x1f:
    decode_i64_mips16((DisasContext_conflict6 *)dcbase,uVar17,uVar16,(int16_t)uVar24,0);
    goto LAB_0086901c;
  }
LAB_0086a10e:
  gen_ld((DisasContext_conflict6 *)dcbase,uVar6,uVar17,uVar32,uVar24);
LAB_0086901c:
  TStackY_d0 = 2;
switchD_0086ab9b_default:
  if (_Var5) {
    paVar15 = &tcg_ctx->ops;
    if (local_90 != (void *)0x0) {
      paVar15 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_90 + 8);
    }
    paVar15->tqh_first->args[1] = TStackY_d0;
  }
  uVar8 = (uint)dcbase[2].pc_next;
  if ((uVar8 & 0x87f800) == 0) {
LAB_00869072:
    if (uVar23 == 0) goto LAB_00869082;
  }
  else {
    if ((uVar8 & 0x818000) == 0) {
      uVar23 = 1;
    }
    if ((~uVar8 & 0x800400) != 0) goto LAB_00869072;
  }
  gen_branch((DisasContext_conflict6 *)dcbase,(int)TStackY_d0);
LAB_00869082:
  tVar22 = TStackY_d0 + dcbase->pc_next;
  dcbase->pc_next = tVar22;
  if (dcbase->is_jmp == DISAS_NEXT) {
    if ((dcbase->singlestep_enabled == true) && ((dcbase[2].pc_next & 0x87f800) == 0)) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
    if (0xfff < tVar22 - dcbase[1].pc_first) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
}

Assistant:

static void mips_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    CPUMIPSState *env = cs->env_ptr;
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *tcg_op, *prev_op = NULL;
    int insn_bytes;
    int is_slot;
    bool hook_insn = false;

    is_slot = ctx->hflags & MIPS_HFLAG_BMASK;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // raise a special interrupt to quit
        gen_helper_wait(tcg_ctx, tcg_ctx->cpu_env);
        ctx->base.is_jmp = DISAS_NORETURN;
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

        // Sync PC in advance
        gen_save_pc(tcg_ctx, ctx->base.pc_next);

        // save the last operand
        prev_op = tcg_last_op(tcg_ctx);
        hook_insn = true;
        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
        // Don't let unicorn stop at the branch delay slot.
        if (!is_slot) {
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }
    }
    
    if (ctx->insn_flags & ISA_NANOMIPS32) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_nanomips_opc(env, ctx);
    } else if (!(ctx->hflags & MIPS_HFLAG_M16)) {
        ctx->opcode = cpu_ldl_code(env, ctx->base.pc_next);
        insn_bytes = 4;
        decode_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MICROMIPS) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_micromips_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MIPS16) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_mips16_opc(env, ctx);
    } else {
        generate_exception_end(ctx, EXCP_RI);
        g_assert(ctx->base.is_jmp == DISAS_NORETURN);
        return;
    }

    if (hook_insn) {
        // Unicorn: patch the callback to have the proper instruction size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this instruction is the first emulated code ever,
            // so the instruction operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = insn_bytes;
    }

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        if (!(ctx->hflags & (MIPS_HFLAG_BDS16 | MIPS_HFLAG_BDS32 |
                             MIPS_HFLAG_FBNSLOT))) {
            /*
             * Force to generate branch as there is neither delay nor
             * forbidden slot.
             */
            is_slot = 1;
        }
        if ((ctx->hflags & MIPS_HFLAG_M16) &&
            (ctx->hflags & MIPS_HFLAG_FBNSLOT)) {
            /*
             * Force to generate branch as microMIPS R6 doesn't restrict
             * branches in the forbidden slot.
             */
            is_slot = 1;
        }
    }
    if (is_slot) {
        gen_branch(ctx, insn_bytes);
    }
    ctx->base.pc_next += insn_bytes;

    if (ctx->base.is_jmp != DISAS_NEXT) {
        return;
    }
    /*
     * Execute a branch and its delay slot as a single instruction.
     * This is what GDB expects and is consistent with what the
     * hardware does (e.g. if a delay slot instruction faults, the
     * reported PC is the PC of the branch).
     */
    if (ctx->base.singlestep_enabled &&
        (ctx->hflags & MIPS_HFLAG_BMASK) == 0) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
    if (ctx->base.pc_next - ctx->page_start >= TARGET_PAGE_SIZE) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
}